

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  bool bVar1;
  bool is_open;
  ImVec2 local_50;
  ImGuiViewport *local_48;
  ImGuiViewport *viewport;
  ImGuiWindow *pIStack_38;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool *pbStack_20;
  ImGuiWindowFlags flags_local;
  bool *p_open_local;
  char *name_local;
  
  window = (ImGuiWindow *)GImGui;
  pIStack_38 = GImGui->CurrentWindow;
  g._4_4_ = flags;
  pbStack_20 = p_open;
  p_open_local = (bool *)name;
  viewport._4_4_ = ImGuiWindow::GetID(pIStack_38,name,(char *)0x0);
  bVar1 = IsPopupOpen(viewport._4_4_,0);
  if (bVar1) {
    if (((uint)window[0x11].ScrollTargetEdgeSnapDist.y & 1) == 0) {
      local_48 = GetMainViewport();
      local_50 = ImGuiViewport::GetCenter(local_48);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa8,0.5,0.5);
      SetNextWindowPos(&local_50,4,(ImVec2 *)&stack0xffffffffffffffa8);
    }
    g._4_4_ = g._4_4_ | 0xc000020;
    name_local._7_1_ = Begin(p_open_local,pbStack_20,g._4_4_);
    if ((!name_local._7_1_) || ((pbStack_20 != (bool *)0x0 && ((*pbStack_20 & 1U) == 0)))) {
      EndPopup();
      if (name_local._7_1_) {
        ClosePopupToLevel(window[0x11].DC.TreeDepth,true);
      }
      name_local._7_1_ = false;
    }
  }
  else {
    ImGuiNextWindowData::ClearFlags((ImGuiNextWindowData *)&window[0x11].ScrollTargetEdgeSnapDist.y)
    ;
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default for increased visibility
    // (this won't really last as settings will kick in, and is mostly for backward compatibility. user may do the same themselves)
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
    {
        const ImGuiViewport* viewport = GetMainViewport();
        SetNextWindowPos(viewport->GetCenter(), ImGuiCond_FirstUseEver, ImVec2(0.5f, 0.5f));
    }

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}